

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_if.hpp
# Opt level: O3

void __thiscall
ranges::
remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:17:10)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:24:10)>,_ranges::logical_negate<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:34:10)>_>
::cache_begin(remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>
              *this)

{
  base_range_t *this_00;
  void *address;
  iterator_t<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>
  local_38;
  
  if ((this->begin_).
      super_optional<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
      .
      super_move_assign_layer<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
      .
      super_optional_storage<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>,_true>
      .engaged_ == false) {
    this_00 = &(this->
               super_view_adaptor<ranges::remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>,_ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_(ranges::cardinality)_1>
               ).rng_;
    remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:17:10)>,_ranges::logical_negate<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:24:10)>_>
    ::cache_begin(&this_00->
                   super_remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>
                 );
    if (*(bool *)((long)&(this->
                         super_view_adaptor<ranges::remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>,_ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_(ranges::cardinality)_1>
                         ).rng_.
                         super_remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>
                         .begin_.
                         super_optional<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>_>
                         .
                         super_move_assign_layer<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>_>
                         .
                         super_optional_storage<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_true>
                 + 0x10) == false) {
      __assert_fail("engaged_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/range-v3/include/range/v3/utility/optional.hpp"
                    ,0xb2,
                    "T &ranges::detail::optional_adl::optional_base<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const std::reference_wrapper<const cppti::TalksDB::TalkRef> *, std::vector<std::reference_wrapper<const cppti::TalksDB::TalkRef>>>, ranges::remove_if_view<ranges::ref_view<const std::vector<std::reference_wrapper<const cppti::TalksDB::TalkRef>>>, ranges::logical_negate<(lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:17:10)>>::adaptor>>>::operator*() & [T = ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const std::reference_wrapper<const cppti::TalksDB::TalkRef> *, std::vector<std::reference_wrapper<const cppti::TalksDB::TalkRef>>>, ranges::remove_if_view<ranges::ref_view<const std::vector<std::reference_wrapper<const cppti::TalksDB::TalkRef>>>, ranges::logical_negate<(lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:17:10)>>::adaptor>>]"
                   );
    }
    local_38.
    super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
    .
    super_mixin_base_t<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_basic_mixin<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_box<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
    .value.
    super_adaptor_value_type_<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
    .data_.
    super_box<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
    .value.
    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
    .
    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void>
    .
    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
    .
    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
    .
    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
    .value.
    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor,_1>
    .data_.
    super_box<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
    .value._M_current =
         *(__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>
           *)&(this->
              super_view_adaptor<ranges::remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>,_ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_(ranges::cardinality)_1>
              ).rng_.
              super_remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>
              .begin_.
              super_optional<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>_>
              .
              super_move_assign_layer<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>_>
              .
              super_optional_storage<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_true>
              .field_0.data_.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
    ;
    local_38.
    super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
    .
    super_mixin_base_t<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_basic_mixin<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_box<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
    .value.
    super_adaptor_value_type_<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
    .data_.
    super_box<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
    .value.
    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
    .
    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void>
    .
    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
    .
    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
    .
    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
    .value.
    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor,_1>
    .data_.
    super_box<ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
    .value.rng_ = *(adaptor *)
                   ((long)&(this->
                           super_view_adaptor<ranges::remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>,_ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_(ranges::cardinality)_1>
                           ).rng_.
                           super_remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>
                           .begin_.
                           super_optional<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>_>
                           .
                           super_move_assign_layer<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>_>
                           .
                           super_optional_storage<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_true>
                   + 8);
    local_38.
    super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
    .
    super_mixin_base_t<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_basic_mixin<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
    .
    super_box<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
    .value.
    super_adaptor_value_type_<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
    .data_.
    super_box<ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
    .value.rng_ = (adaptor)(adaptor)this_00;
    satisfy_forward(this,&local_38);
    (((box<ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
       *)((long)&(this->begin_).
                 super_optional<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
                 .
                 super_move_assign_layer<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
                 .
                 super_optional_storage<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>,_true>
                 .field_0.data_.
                 super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
                 .
                 super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
         + 0x10))->value).rng_ =
         (remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>
          *)local_38.
            super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
            .
            super_mixin_base_t<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_basic_mixin<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_box<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
            .value.
            super_adaptor_value_type_<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
            .data_.
            super_box<ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
            .value.rng_;
    *(__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>
      *)&(this->begin_).
         super_optional<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
         .
         super_move_assign_layer<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
         .
         super_optional_storage<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>,_true>
         .field_0.data_.
         super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
         .
         super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
         .
         super_mixin_base_t<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
         = local_38.
           super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
           .
           super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
           .
           super_mixin_base_t<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
           .
           super_basic_mixin<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
           .
           super_box<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
           .value.
           super_adaptor_value_type_<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
           .data_.
           super_box<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
           .value.
           super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
           .
           super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void>
           .
           super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
           .
           super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
           .
           super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
           .value.
           super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor,_1>
           .data_.
           super_box<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
           .value._M_current;
    (((box<ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
       *)((long)&(this->begin_).
                 super_optional<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
                 .
                 super_move_assign_layer<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
                 .
                 super_optional_storage<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>,_true>
                 .field_0.data_.
                 super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
                 .
                 super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
         + 8))->value).rng_ =
         (remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>
          *)local_38.
            super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
            .
            super_mixin_base_t<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_basic_mixin<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_box<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
            .value.
            super_adaptor_value_type_<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
            .data_.
            super_box<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
            .value.
            super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
            .
            super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void>
            .
            super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
            .
            super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>
            .
            super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
            .value.
            super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor,_1>
            .data_.
            super_box<ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
            .value.rng_;
    (this->begin_).
    super_optional<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
    .
    super_move_assign_layer<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>_>
    .
    super_optional_storage<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>,_true>
    .engaged_ = true;
  }
  return;
}

Assistant:

constexpr void cache_begin()
        {
            if(begin_)
                return;
            auto it = ranges::begin(this->base());
            satisfy_forward(it);
            begin_.emplace(std::move(it));
        }